

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::anon_unknown_0::LongShaderGenerator::beginBlock(LongShaderGenerator *this)

{
  bool bVar1;
  reference pbVar2;
  int precision;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  float local_ac;
  undefined1 local_a8 [4];
  float varValue;
  string varName;
  _Self local_80;
  const_iterator nameIter;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  ShaderScope scope;
  LongShaderGenerator *this_local;
  
  scope._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"{",&local_61);
  addLine(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  NameGenerator::beginScope(&this->m_nameGen);
  NameGenerator::makeNames
            (&this->m_nameGen,(ShaderScope *)local_40,(this->m_spec).variablesPerBlock);
  std::
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back(&this->m_scopes,(value_type *)local_40);
  local_80._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
  while( true ) {
    varName.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
    bVar1 = std::operator!=(&local_80,(_Self *)((long)&varName.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_80);
    std::__cxx11::string::string((string *)local_a8,(string *)pbVar2);
    local_ac = de::Random::getFloat(&this->m_rnd);
    std::operator+(&local_130,"mediump float ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_110,&local_130," = ");
    de::floatToString_abi_cxx11_(&local_150,(de *)0x5,local_ac,precision);
    std::operator+(&local_f0,&local_110,&local_150);
    std::operator+(&local_d0,&local_f0,"f;");
    addLine(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_varNames,(value_type *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_80,0);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_40);
  return;
}

Assistant:

void LongShaderGenerator::beginBlock (void)
{
	ShaderScope scope;

	addLine("{");

	m_nameGen.beginScope();
	m_nameGen.makeNames(scope, m_spec.variablesPerBlock);

	m_scopes.push_back(scope);

	for (ShaderScope::const_iterator nameIter = scope.begin(); nameIter != scope.end(); nameIter++)
	{
		const std::string	varName		= *nameIter;
		const float			varValue	= m_rnd.getFloat();

		addLine("mediump float " + varName + " = " + de::floatToString(varValue, 5) + "f;");
		m_varNames.push_back(varName);
	}
}